

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::TransformFeedback::TransformFeedbackCase::init
          (TransformFeedbackCase *this,EVP_PKEY_CTX *ctx)

{
  glGenBuffersFunc p_Var1;
  Functions *gl_00;
  Functions *log_00;
  bool bVar2;
  int iVar3;
  deUint32 program;
  GLenum err;
  int extraout_EAX;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ShaderProgram *pSVar5;
  ShaderInfo *pSVar6;
  ProgramInfo *pPVar7;
  NotSupportedError *pNVar8;
  TestError *pTVar9;
  MessageBuilder *pMVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  vector<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
  *pvVar12;
  pointer pOVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar14;
  reference pvVar15;
  TypedObjectWrapper<(glu::ObjectType)4> *this_01;
  byte local_3b1;
  __normal_iterator<deqp::gles3::Functional::TransformFeedback::Output_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>_>
  local_3a0;
  __normal_iterator<deqp::gles3::Functional::TransformFeedback::Output_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>_>
  local_398;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Output_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>_>
  local_390;
  const_iterator outIter_1;
  int totalSize;
  int local_374;
  __normal_iterator<deqp::gles3::Functional::TransformFeedback::Output_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>_>
  local_370;
  __normal_iterator<deqp::gles3::Functional::TransformFeedback::Output_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>_>
  local_368;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Output_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>_>
  local_360;
  const_iterator outIter;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  Array<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1c8;
  MessageBuilder local_1b8;
  byte local_21;
  Functions *pFStack_20;
  bool linkFail;
  Functions *gl;
  TestLog *log;
  TransformFeedbackCase *this_local;
  
  log = (TestLog *)this;
  gl = (Functions *)
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar4 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  pFStack_20 = (Functions *)CONCAT44(extraout_var,iVar3);
  pRVar4 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  pSVar5 = createVertexCaptureProgram
                     (pRVar4,&this->m_progSpec,this->m_bufferMode,this->m_primitiveType);
  this->m_program = pSVar5;
  glu::operator<<((TestLog *)gl,this->m_program);
  bVar2 = glu::ShaderProgram::isOk(this->m_program);
  if (bVar2) {
    tcu::TestLog::operator<<(&local_1b8,(TestLog *)gl,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<
                        (&local_1b8,(char (*) [30])"Transform feedback varyings: ");
    pvVar11 = ProgramSpec::getTransformFeedbackVaryings_abi_cxx11_(&this->m_progSpec);
    local_1d0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(pvVar11);
    pvVar11 = ProgramSpec::getTransformFeedbackVaryings_abi_cxx11_(&this->m_progSpec);
    local_1d8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(pvVar11);
    local_1c8 = tcu::
                formatArray<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          (&local_1d0,&local_1d8);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_1c8);
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&outIter,(TestLog *)gl,(BeginMessageToken *)&tcu::TestLog::Message)
    ;
    pMVar10 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&outIter,
                         (char (*) [50])"Transform feedback varyings reported by compiler:");
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&outIter);
    log_00 = gl;
    gl_00 = pFStack_20;
    program = glu::ShaderProgram::getProgram(this->m_program);
    logTransformFeedbackVaryings((TestLog *)log_00,gl_00,program);
    pvVar12 = ProgramSpec::getVaryings(&this->m_progSpec);
    bVar2 = ProgramSpec::isPointSizeUsed(&this->m_progSpec);
    computeInputLayout(&this->m_attributes,&this->m_inputStride,pvVar12,bVar2);
    pvVar12 = ProgramSpec::getVaryings(&this->m_progSpec);
    pvVar11 = ProgramSpec::getTransformFeedbackVaryings_abi_cxx11_(&this->m_progSpec);
    computeTransformFeedbackOutputs
              (&this->m_transformFeedbackOutputs,&this->m_attributes,pvVar12,pvVar11,
               this->m_bufferMode);
    if (this->m_bufferMode == 0x8c8d) {
      local_368._M_current =
           (Output *)
           std::
           vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
           ::begin(&this->m_transformFeedbackOutputs);
      __gnu_cxx::
      __normal_iterator<deqp::gles3::Functional::TransformFeedback::Output_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Output,std::allocator<deqp::gles3::Functional::TransformFeedback::Output>>>
      ::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Output*>
                ((__normal_iterator<deqp::gles3::Functional::TransformFeedback::Output_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Output,std::allocator<deqp::gles3::Functional::TransformFeedback::Output>>>
                  *)&local_360,&local_368);
      while( true ) {
        local_370._M_current =
             (Output *)
             std::
             vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
             ::end(&this->m_transformFeedbackOutputs);
        bVar2 = __gnu_cxx::operator!=(&local_360,&local_370);
        if (!bVar2) break;
        pOVar13 = __gnu_cxx::
                  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Output_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>_>
                  ::operator->(&local_360);
        local_374 = glu::VarType::getScalarSize(&pOVar13->type);
        local_374 = local_374 << 2;
        std::vector<int,_std::allocator<int>_>::push_back(&this->m_bufferStrides,&local_374);
        __gnu_cxx::
        __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Output_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>_>
        ::operator++(&local_360,0);
      }
    }
    else {
      outIter_1._M_current._4_4_ = 0;
      local_398._M_current =
           (Output *)
           std::
           vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
           ::begin(&this->m_transformFeedbackOutputs);
      __gnu_cxx::
      __normal_iterator<deqp::gles3::Functional::TransformFeedback::Output_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Output,std::allocator<deqp::gles3::Functional::TransformFeedback::Output>>>
      ::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Output*>
                ((__normal_iterator<deqp::gles3::Functional::TransformFeedback::Output_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Output,std::allocator<deqp::gles3::Functional::TransformFeedback::Output>>>
                  *)&local_390,&local_398);
      while( true ) {
        local_3a0._M_current =
             (Output *)
             std::
             vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
             ::end(&this->m_transformFeedbackOutputs);
        bVar2 = __gnu_cxx::operator!=(&local_390,&local_3a0);
        if (!bVar2) break;
        pOVar13 = __gnu_cxx::
                  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Output_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>_>
                  ::operator->(&local_390);
        iVar3 = glu::VarType::getScalarSize(&pOVar13->type);
        outIter_1._M_current._4_4_ = iVar3 * 4 + outIter_1._M_current._4_4_;
        __gnu_cxx::
        __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Output_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>_>
        ::operator++(&local_390,0);
      }
      std::vector<int,_std::allocator<int>_>::push_back
                (&this->m_bufferStrides,(value_type_conflict1 *)((long)&outIter_1._M_current + 4));
    }
    this_00 = &this->m_outputBuffers;
    sVar14 = std::vector<int,_std::allocator<int>_>::size(&this->m_bufferStrides);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this_00,sVar14);
    p_Var1 = pFStack_20->genBuffers;
    sVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
    pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,0);
    (*p_Var1)((GLsizei)sVar14,pvVar15);
    this_01 = (TypedObjectWrapper<(glu::ObjectType)4> *)operator_new(0x18);
    pRVar4 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
    glu::TypedObjectWrapper<(glu::ObjectType)4>::TypedObjectWrapper(this_01,pRVar4);
    this->m_transformFeedback = this_01;
    err = (*pFStack_20->getError)();
    glu::checkError(err,"init",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                    ,0x3d4);
    this->m_iterNdx = 0;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    return extraout_EAX;
  }
  pSVar6 = glu::ShaderProgram::getShaderInfo(this->m_program,SHADERTYPE_VERTEX,0);
  local_3b1 = 0;
  if ((pSVar6->compileOk & 1U) != 0) {
    pSVar6 = glu::ShaderProgram::getShaderInfo(this->m_program,SHADERTYPE_FRAGMENT,0);
    local_3b1 = 0;
    if ((pSVar6->compileOk & 1U) != 0) {
      pPVar7 = glu::ShaderProgram::getProgramInfo(this->m_program);
      local_3b1 = pPVar7->linkOk ^ 0xff;
    }
  }
  local_21 = local_3b1 & 1;
  if (local_21 == 0) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,"Compile failed","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
               ,0x3ad);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  bVar2 = isProgramSupported(pFStack_20,&this->m_progSpec,this->m_bufferMode);
  if (!bVar2) {
    pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar8,"Implementation limits execeeded","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
               ,0x3a6);
    __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  bVar2 = hasArraysInTFVaryings(&this->m_progSpec);
  if (bVar2) {
    pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar8,"Capturing arrays is not supported (undefined in specification)","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
               ,0x3a8);
    __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar9,"Link failed","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
             ,0x3aa);
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void TransformFeedbackCase::init (void)
{
	TestLog&				log	= m_testCtx.getLog();
	const glw::Functions&	gl	= m_context.getRenderContext().getFunctions();

	DE_ASSERT(!m_program);
	m_program = createVertexCaptureProgram(m_context.getRenderContext(), m_progSpec, m_bufferMode, m_primitiveType);

	log << *m_program;
	if (!m_program->isOk())
	{
		const bool linkFail = m_program->getShaderInfo(glu::SHADERTYPE_VERTEX).compileOk &&
							  m_program->getShaderInfo(glu::SHADERTYPE_FRAGMENT).compileOk &&
							  !m_program->getProgramInfo().linkOk;

		if (linkFail)
		{
			if (!isProgramSupported(gl, m_progSpec, m_bufferMode))
				throw tcu::NotSupportedError("Implementation limits execeeded", "", __FILE__, __LINE__);
			else if (hasArraysInTFVaryings(m_progSpec))
				throw tcu::NotSupportedError("Capturing arrays is not supported (undefined in specification)", "", __FILE__, __LINE__);
			else
				throw tcu::TestError("Link failed", "", __FILE__, __LINE__);
		}
		else
			throw tcu::TestError("Compile failed", "", __FILE__, __LINE__);
	}

	log << TestLog::Message << "Transform feedback varyings: " << tcu::formatArray(m_progSpec.getTransformFeedbackVaryings().begin(), m_progSpec.getTransformFeedbackVaryings().end()) << TestLog::EndMessage;

	// Print out transform feedback points reported by GL.
	log << TestLog::Message << "Transform feedback varyings reported by compiler:" << TestLog::EndMessage;
	logTransformFeedbackVaryings(log, gl, m_program->getProgram());

	// Compute input specification.
	computeInputLayout(m_attributes, m_inputStride, m_progSpec.getVaryings(), m_progSpec.isPointSizeUsed());

	// Build list of varyings used in transform feedback.
	computeTransformFeedbackOutputs(m_transformFeedbackOutputs, m_attributes, m_progSpec.getVaryings(), m_progSpec.getTransformFeedbackVaryings(), m_bufferMode);
	DE_ASSERT(!m_transformFeedbackOutputs.empty());

	// Buffer strides.
	DE_ASSERT(m_bufferStrides.empty());
	if (m_bufferMode == GL_SEPARATE_ATTRIBS)
	{
		for (vector<Output>::const_iterator outIter = m_transformFeedbackOutputs.begin(); outIter != m_transformFeedbackOutputs.end(); outIter++)
			m_bufferStrides.push_back(outIter->type.getScalarSize()*(int)sizeof(deUint32));
	}
	else
	{
		int totalSize = 0;
		for (vector<Output>::const_iterator outIter = m_transformFeedbackOutputs.begin(); outIter != m_transformFeedbackOutputs.end(); outIter++)
			totalSize += outIter->type.getScalarSize()*(int)sizeof(deUint32);

		m_bufferStrides.push_back(totalSize);
	}

	// \note Actual storage is allocated in iterate().
	m_outputBuffers.resize(m_bufferStrides.size());
	gl.genBuffers((glw::GLsizei)m_outputBuffers.size(), &m_outputBuffers[0]);

	DE_ASSERT(!m_transformFeedback);
	m_transformFeedback = new glu::TransformFeedback(m_context.getRenderContext());

	GLU_EXPECT_NO_ERROR(gl.getError(), "init");

	m_iterNdx = 0;
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}